

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O1

void __thiscall
QtMWidgets::AbstractScrollArea::_q_kineticScrollingFinished(AbstractScrollArea *this)

{
  AbstractScrollAreaPrivate *this_00;
  
  this_00 = (this->d).d;
  if (((this_00->horIndicator->needPaint != false) || (this_00->vertIndicator->needPaint == true))
     && ((this_00->horIndicator->policy == ScrollIndicatorAsNeeded ||
         (this_00->vertIndicator->policy == ScrollIndicatorAsNeeded)))) {
    AbstractScrollAreaPrivate::animateScrollIndicators(this_00);
  }
  AbstractScrollAreaPrivate::animateHiddingBlurEffect((this->d).d);
  return;
}

Assistant:

void
AbstractScrollArea::_q_kineticScrollingFinished()
{
	if( d->horIndicator->needPaint || d->vertIndicator->needPaint )
	{
		if( d->horIndicator->policy == ScrollIndicatorAsNeeded ||
			d->vertIndicator->policy == ScrollIndicatorAsNeeded )
				d->animateScrollIndicators();
	}

	d->animateHiddingBlurEffect();
}